

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
::
find<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry,kj::Array<unsigned_char>&>
          (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Array<unsigned_char>,_capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Entry>
                 table,Array<unsigned_char> *params)

{
  Disposer *pDVar1;
  Vat *pVVar2;
  uchar *__s1;
  size_t __n;
  uint uVar3;
  int iVar4;
  Disposer *pDVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  Entry *pEVar8;
  ArrayPtr<const_unsigned_char> *in_R8;
  int iVar9;
  Vat *pVVar10;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  Maybe<unsigned_long> MVar13;
  
  MVar12.ptr.field_1.value = table.size_;
  pEVar8 = table.ptr;
  if ((pEVar8->value).ptr == (Vat *)0x0) {
    *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
             )0x0;
    MVar12.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar12.ptr;
  }
  uVar3 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R8);
  pDVar1 = (pEVar8->value).disposer;
  pVVar2 = (pEVar8->value).ptr;
  uVar11 = (ulong)((int)pVVar2 - 1U & uVar3);
  iVar9 = *(int *)((long)&pDVar1[uVar11]._vptr_Disposer + 4);
  aVar7 = extraout_RDX;
  if (iVar9 != 0) {
    pDVar5 = pDVar1 + uVar11;
    __s1 = in_R8->ptr;
    __n = in_R8->size_;
    do {
      if ((iVar9 != 1) && (*(uint *)&pDVar5->_vptr_Disposer == uVar3)) {
        lVar6 = (ulong)(iVar9 - 2) * 0x38;
        if (__n == *(size_t *)(MVar12.ptr.field_1.value + 8 + lVar6)) {
          if (__n != 0) {
            iVar4 = bcmp(__s1,*(void **)(MVar12.ptr.field_1.value + lVar6),__n);
            if (iVar4 != 0) goto LAB_0033fac5;
          }
          aVar7.value = 0;
          *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(iVar9 - 2);
          goto LAB_0033fafe;
        }
      }
LAB_0033fac5:
      aVar7.value = 0;
      pVVar10 = (Vat *)(uVar11 + 1);
      uVar11 = (ulong)pVVar10 & 0xffffffff;
      if (pVVar10 == pVVar2) {
        uVar11 = 0;
      }
      pDVar5 = pDVar1 + uVar11;
      iVar9 = *(int *)((long)&pDVar5->_vptr_Disposer + 4);
    } while (iVar9 != 0);
  }
  *this = (HashIndex<kj::HashMap<kj::Array<unsigned_char>,capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyEmbargo>::Callbacks>
           )0x0;
LAB_0033fafe:
  MVar13.ptr.field_1.value = aVar7.value;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }